

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::EagerPromiseNodeBase::EagerPromiseNodeBase
          (EagerPromiseNodeBase *this,Own<kj::_::PromiseNode> *dependencyParam,
          ExceptionOrValue *resultRef)

{
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EventLoop *pEVar5;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR___cxa_pure_virtual_00448c40;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_004488d8;
  pEVar5 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar5;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00448b80;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00448bb8;
  uVar2 = *(undefined4 *)((long)&dependencyParam->disposer + 4);
  uVar3 = *(undefined4 *)&dependencyParam->ptr;
  uVar4 = *(undefined4 *)((long)&dependencyParam->ptr + 4);
  *(undefined4 *)&(this->dependency).disposer = *(undefined4 *)&dependencyParam->disposer;
  *(undefined4 *)((long)&(this->dependency).disposer + 4) = uVar2;
  *(undefined4 *)&(this->dependency).ptr = uVar3;
  *(undefined4 *)((long)&(this->dependency).ptr + 4) = uVar4;
  dependencyParam->ptr = (PromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  this->resultRef = resultRef;
  pPVar1 = (this->dependency).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

EagerPromiseNodeBase::EagerPromiseNodeBase(
    Own<PromiseNode>&& dependencyParam, ExceptionOrValue& resultRef)
    : dependency(kj::mv(dependencyParam)), resultRef(resultRef) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}